

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O0

void __thiscall ipx::Iterate::make_implied_eq(Iterate *this,Int j)

{
  double *pdVar1;
  reference pvVar2;
  int in_ESI;
  long in_RDI;
  
  pdVar1 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x18),(long)in_ESI);
  *pdVar1 = INFINITY;
  pdVar1 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x28),(long)in_ESI);
  *pdVar1 = INFINITY;
  pdVar1 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x48),(long)in_ESI);
  *pdVar1 = 0.0;
  pdVar1 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x58),(long)in_ESI);
  *pdVar1 = 0.0;
  pvVar2 = std::vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>::
           operator[]((vector<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                       *)(in_RDI + 0x68),(long)in_ESI);
  *pvVar2 = IMPLIED_EQ;
  *(undefined1 *)(in_RDI + 0x108) = 0;
  return;
}

Assistant:

void Iterate::make_implied_eq(Int j) {
    xl_[j] = INFINITY;
    xu_[j] = INFINITY;
    zl_[j] = 0.0;
    zu_[j] = 0.0;
    variable_state_[j] = StateDetail::IMPLIED_EQ;
    evaluated_ = false;
}